

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3243.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamANCF_3243::ComputeInternalForces
          (ChElementBeamANCF_3243 *this,ChVectorDynamic<> *Fi)

{
  if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows != 0x18)
  {
    __assert_fail("Fi.size() == 3 * NSF",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamANCF_3243.cpp"
                  ,0x184,
                  "virtual void chrono::fea::ChElementBeamANCF_3243::ComputeInternalForces(ChVectorDynamic<> &)"
                 );
  }
  if (this->m_method == ContInt) {
    if (this->m_damping_enabled != true) {
      ComputeInternalForcesContIntNoDamping(this,Fi);
      return;
    }
    ComputeInternalForcesContIntDamping(this,Fi);
    return;
  }
  ComputeInternalForcesContIntPreInt(this,Fi);
  return;
}

Assistant:

void ChElementBeamANCF_3243::ComputeInternalForces(ChVectorDynamic<>& Fi) {
    assert(Fi.size() == 3 * NSF);

    if (m_method == IntFrcMethod::ContInt) {
        if (m_damping_enabled) {  // If linear Kelvin-Voigt viscoelastic material model is enabled
            ComputeInternalForcesContIntDamping(Fi);
        } else {
            ComputeInternalForcesContIntNoDamping(Fi);
        }
    } else {
        ComputeInternalForcesContIntPreInt(Fi);
    }
}